

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

int SUNDlsMat_denseGEQRF
              (sunrealtype **a,sunindextype m,sunindextype n,sunrealtype *beta,sunrealtype *v)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  sunrealtype *col_k;
  sunrealtype *col_j;
  sunrealtype v1_2;
  sunrealtype v1;
  sunrealtype mu;
  sunrealtype s;
  sunrealtype ajj;
  double local_88;
  double local_80;
  long local_78;
  long local_70;
  long local_68;
  double local_38;
  
  for (local_70 = 0; local_70 < in_RDX; local_70 = local_70 + 1) {
    lVar2 = *(long *)(in_RDI + local_70 * 8);
    local_88 = *(double *)(lVar2 + local_70 * 8);
    *in_R8 = 0x3ff0000000000000;
    local_38 = 0.0;
    for (local_68 = 1; local_68 < in_RSI - local_70; local_68 = local_68 + 1) {
      in_R8[local_68] = *(undefined8 *)(lVar2 + (local_68 + local_70) * 8);
      local_38 = (double)in_R8[local_68] * (double)in_R8[local_68] + local_38;
    }
    if ((local_38 != 0.0) || (NAN(local_38))) {
      if (0.0 < local_88 * local_88 + local_38) {
        local_80 = sqrt(local_88 * local_88 + local_38);
      }
      else {
        local_80 = 0.0;
      }
      if (0.0 < local_88) {
        local_88 = -local_38 / (local_88 + local_80);
      }
      else {
        local_88 = local_88 - local_80;
      }
      *(double *)(in_RCX + local_70 * 8) =
           (local_88 * local_88 * 2.0) / (local_38 + local_88 * local_88);
      for (local_68 = 1; local_68 < in_RSI - local_70; local_68 = local_68 + 1) {
        in_R8[local_68] = (double)in_R8[local_68] / local_88;
      }
    }
    else {
      *(undefined8 *)(in_RCX + local_70 * 8) = 0;
    }
    for (local_78 = local_70; local_78 < in_RDX; local_78 = local_78 + 1) {
      lVar3 = *(long *)(in_RDI + local_78 * 8);
      local_38 = 0.0;
      for (local_68 = 0; local_68 < in_RSI - local_70; local_68 = local_68 + 1) {
        local_38 = *(double *)(lVar3 + (local_68 + local_70) * 8) * (double)in_R8[local_68] +
                   local_38;
      }
      dVar1 = *(double *)(in_RCX + local_70 * 8);
      for (local_68 = 0; local_68 < in_RSI - local_70; local_68 = local_68 + 1) {
        *(double *)(lVar3 + (local_68 + local_70) * 8) =
             -(dVar1 * local_38) * (double)in_R8[local_68] +
             *(double *)(lVar3 + (local_68 + local_70) * 8);
      }
    }
    if (local_70 < in_RSI + -1) {
      for (local_68 = 1; local_68 < in_RSI - local_70; local_68 = local_68 + 1) {
        *(undefined8 *)(lVar2 + (local_68 + local_70) * 8) = in_R8[local_68];
      }
    }
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseGEQRF(sunrealtype** a, sunindextype m, sunindextype n,
                         sunrealtype* beta, sunrealtype* v)
{
  sunrealtype ajj, s, mu, v1, v1_2;
  sunrealtype *col_j, *col_k;
  sunindextype i, j, k;

  /* For each column...*/
  for (j = 0; j < n; j++)
  {
    col_j = a[j];

    ajj = col_j[j];

    /* Compute the j-th Householder vector (of length m-j) */
    v[0] = ONE;
    s    = ZERO;
    for (i = 1; i < m - j; i++)
    {
      v[i] = col_j[i + j];
      s += v[i] * v[i];
    }

    if (s != ZERO)
    {
      mu      = SUNRsqrt(ajj * ajj + s);
      v1      = (ajj <= ZERO) ? ajj - mu : -s / (ajj + mu);
      v1_2    = v1 * v1;
      beta[j] = TWO * v1_2 / (s + v1_2);
      for (i = 1; i < m - j; i++) { v[i] /= v1; }
    }
    else { beta[j] = ZERO; }

    /* Update upper triangle of A (load R) */
    for (k = j; k < n; k++)
    {
      col_k = a[k];
      s     = ZERO;
      for (i = 0; i < m - j; i++) { s += col_k[i + j] * v[i]; }
      s *= beta[j];
      for (i = 0; i < m - j; i++) { col_k[i + j] -= s * v[i]; }
    }

    /* Update A (load Householder vector) */
    if (j < m - 1)
    {
      for (i = 1; i < m - j; i++) { col_j[i + j] = v[i]; }
    }
  }

  return (0);
}